

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah.h
# Opt level: O3

void std::
     __unguarded_linear_insert<embree::sse2::GeneralBVHBuilder::BuildRecordT<embree::sse2::PrimInfoExtRange,embree::sse2::BinSplit<32ul>>*,__gnu_cxx::__ops::_Val_comp_iter<std::greater<embree::sse2::GeneralBVHBuilder::BuildRecordT<embree::sse2::PrimInfoExtRange,embree::sse2::BinSplit<32ul>>>>>
               (undefined8 *__last)

{
  undefined1 uVar1;
  undefined8 uVar2;
  long lVar3;
  long lVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  ulong uVar15;
  
  uVar1 = *(undefined1 *)(__last + 1);
  uVar2 = *__last;
  uVar5 = __last[2];
  uVar6 = __last[3];
  uVar7 = __last[4];
  uVar8 = __last[5];
  uVar9 = __last[6];
  uVar10 = __last[7];
  uVar11 = __last[8];
  uVar12 = __last[9];
  lVar3 = __last[10];
  uVar13 = __last[0xb];
  uVar14 = __last[0xc];
  lVar4 = __last[0xb];
  uVar15 = __last[-3] - __last[-4];
  while (uVar15 < (ulong)(lVar4 - lVar3)) {
    *(undefined1 *)(__last + 1) = *(undefined1 *)(__last + -0xd);
    *__last = __last[-0xe];
    __last[2] = __last[-0xc];
    __last[3] = __last[-0xb];
    __last[4] = __last[-10];
    __last[5] = __last[-9];
    __last[6] = __last[-8];
    __last[7] = __last[-7];
    __last[8] = __last[-6];
    __last[9] = __last[-5];
    __last[10] = __last[-4];
    __last[0xb] = __last[-3];
    __last[0xc] = __last[-2];
    uVar15 = __last[-0x11] - __last[-0x12];
    __last = __last + -0xe;
  }
  *(undefined1 *)(__last + 1) = uVar1;
  *__last = uVar2;
  __last[2] = uVar5;
  __last[3] = uVar6;
  __last[4] = uVar7;
  __last[5] = uVar8;
  __last[6] = uVar9;
  __last[7] = uVar10;
  __last[8] = uVar11;
  __last[9] = uVar12;
  __last[10] = lVar3;
  __last[0xb] = uVar13;
  __last[0xc] = uVar14;
  return;
}

Assistant:

__forceinline BuildRecordT () {}